

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void perfetto::internal::TrackEventInternal::OnStart(StartArgs *args)

{
  anon_class_8_1_89897ddb local_50;
  function<bool_(perfetto::TrackEventSessionObserver_*&)> local_48;
  StartArgs *local_28;
  StartArgs *args_local;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 *local_10;
  
  local_10 = &session_count_;
  local_14 = 1;
  local_18 = 5;
  args_local._4_4_ = 1;
  LOCK();
  UNLOCK();
  args_local._0_4_ = session_count_;
  local_50.args = args;
  local_28 = args;
  session_count_ = session_count_ + 1;
  ::std::function<bool(perfetto::TrackEventSessionObserver*&)>::
  function<perfetto::internal::TrackEventInternal::OnStart(perfetto::DataSourceBase::StartArgs_const&)::__0,void>
            ((function<bool(perfetto::TrackEventSessionObserver*&)> *)&local_48,&local_50);
  anon_unknown_17::ForEachObserver(&local_48);
  std::function<bool_(perfetto::TrackEventSessionObserver_*&)>::~function(&local_48);
  return;
}

Assistant:

void TrackEventInternal::OnStart(const DataSourceBase::StartArgs& args) {
  session_count_.fetch_add(1);
  ForEachObserver([&](TrackEventSessionObserver*& o) {
    if (o)
      o->OnStart(args);
    return true;
  });
}